

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O3

void __thiscall masc::polygon::c_ply::reverse(c_ply *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  pointer pppVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined1 auVar5 [16];
  ply_vertex *this_00;
  
  this_00 = this->head;
  do {
    uVar1 = this_00->next;
    uVar2 = this_00->pre;
    auVar5._8_4_ = (int)uVar1;
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = (int)((ulong)uVar1 >> 0x20);
    this_00->next = (ply_vertex *)uVar2;
    this_00->pre = (ply_vertex *)auVar5._8_8_;
    ply_vertex::computeExtraInfo(this_00);
    iVar4 = (*this_00->_vptr_ply_vertex[3])(this_00);
    this_00 = (ply_vertex *)CONCAT44(extraout_var,iVar4);
  } while (this_00 != this->head);
  this->area = -this->area;
  pppVar3 = (this->all).
            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppVar3) {
    (this->all).
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = pppVar3;
  }
  return;
}

Assistant:

void c_ply::reverse()
{
    ply_vertex * ptr=head;
    do{
        ptr->reverse();
        ptr=ptr->getNext();
    }
    while(ptr!=head); //end while

    this->area=-this->area;
    all.clear();
}